

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O2

void many_handshakes(void)

{
  anon_struct_24_3_a6ccebed *paVar1;
  uint __i;
  int iVar2;
  int iVar3;
  ptls_t *tls;
  size_t sVar4;
  long lVar5;
  ptls_t *ppVar6;
  ptls_cipher_suite_t *ppVar7;
  ptls_async_job_t *ppVar8;
  int *piVar9;
  long lVar10;
  size_t i;
  size_t sVar11;
  ptls_t *local_20e0;
  ulong local_20c8;
  size_t inlen;
  ptls_buffer_t hsbuf;
  timeval start;
  ptls_buffer_t local_2080;
  size_t resplen;
  ptls_buffer_t local_2058;
  timeval end;
  
  tls = ptls_client_new(ctx);
  local_2058.base = "";
  local_2058.capacity = 0;
  local_2058.off = 0;
  local_2058.is_allocated = '\0';
  local_2058.align_bits = '\0';
  iVar2 = ptls_handshake(tls,&local_2058,(void *)0x0,(size_t *)0x0,
                         (ptls_handshake_properties_t *)0x0);
  _ok((uint)(iVar2 == 0x202),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/t/openssl.c",0x1a3);
  local_2080.base = "";
  local_2080.is_allocated = '\0';
  local_2080.align_bits = '\0';
  qat.first_pending = 0;
  local_2080.capacity = 0;
  local_2080.off = 0;
  piVar9 = &qat.conns[0].wait_fd;
  for (sVar4 = 1; sVar4 != 0xb; sVar4 = sVar4 + 1) {
    ((anon_struct_24_3_a6ccebed *)(piVar9 + -4))->next_pending = sVar4;
    *(ptls_t **)(piVar9 + -2) = (ptls_t *)0x0;
    *piVar9 = -1;
    piVar9 = piVar9 + 6;
  }
  qat.conns[9].next_pending = 0xffffffffffffffff;
  local_20e0 = (ptls_t *)0x0;
  gettimeofday((timeval *)&start,(__timezone_ptr_t)0x0);
  local_20c8 = 0;
  lVar10 = 0;
  do {
    while( true ) {
      while (sVar4 = qat.first_pending, qat.first_pending == 0xffffffffffffffff) {
        if (lVar10 == 0) {
          gettimeofday((timeval *)&end,(__timezone_ptr_t)0x0);
          note("run %zu handshakes in %f seconds",
               ((double)end.tv_usec / 1000000.0 + (double)end.tv_sec) -
               ((double)start.tv_usec / 1000000.0 + (double)start.tv_sec),10000);
          local_2058.off = 0;
          resplen = local_2080.off;
          iVar2 = ptls_handshake(tls,&local_2058,local_2080.base,&resplen,
                                 (ptls_handshake_properties_t *)0x0);
          _ok((uint)(iVar2 == 0),"%s %d",
              "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/t/openssl.c",0x203);
          ptls_buffer_dispose(&local_2058);
          ptls_buffer_dispose(&local_2080);
          ptls_free(tls);
          return;
        }
        for (lVar5 = 0; lVar5 != 0x10; lVar5 = lVar5 + 1) {
          (&end.tv_sec)[lVar5] = 0;
        }
        iVar2 = 0;
        for (lVar5 = 0x10; lVar5 != 0x100; lVar5 = lVar5 + 0x18) {
          iVar3 = *(int *)((long)&qat.conns[0].next_pending + lVar5);
          if (iVar3 != -1) {
            (&end.tv_sec)[iVar3 / 0x40] = (&end.tv_sec)[iVar3 / 0x40] | 1L << ((byte)iVar3 & 0x3f);
            if (iVar2 <= iVar3) {
              iVar2 = iVar3 + 1;
            }
          }
        }
        iVar2 = select(iVar2,(fd_set *)&end,(fd_set *)0x0,(fd_set *)0x0,(timeval *)0x0);
        if (0 < iVar2) {
          piVar9 = &qat.conns[0].wait_fd;
          sVar4 = qat.first_pending;
          for (sVar11 = 0; sVar11 != 10; sVar11 = sVar11 + 1) {
            iVar2 = *piVar9;
            if ((iVar2 != -1) &&
               (((ulong)(&end.tv_sec)[iVar2 / 0x40] >> ((long)iVar2 % 0x40 & 0x3fU) & 1) != 0)) {
              *piVar9 = -1;
              ((anon_struct_24_3_a6ccebed *)(piVar9 + -4))->next_pending = sVar4;
              sVar4 = sVar11;
              qat.first_pending = sVar11;
            }
            piVar9 = piVar9 + 6;
          }
        }
      }
      paVar1 = qat.conns + qat.first_pending;
      qat.first_pending = qat.conns[qat.first_pending].next_pending;
      paVar1->next_pending = 0xffffffffffffffff;
      ppVar6 = qat.conns[sVar4].tls;
      if (ppVar6 == (ptls_t *)0x0) {
        ppVar6 = ptls_server_new(ctx_peer);
        qat.conns[sVar4].tls = ppVar6;
        if (local_20e0 == (ptls_t *)0x0) {
          local_20e0 = ppVar6;
        }
        local_20c8 = local_20c8 + 1;
        lVar10 = lVar10 + 1;
      }
      hsbuf.base = (uint8_t *)&end;
      hsbuf.off = 0;
      hsbuf.capacity = 0x2000;
      hsbuf.is_allocated = '\0';
      hsbuf.align_bits = '\0';
      ppVar7 = ptls_get_cipher(ppVar6);
      inlen = 0;
      if (ppVar7 == (ptls_cipher_suite_t *)0x0) {
        inlen = local_2058.off;
      }
      iVar2 = ptls_handshake(qat.conns[sVar4].tls,&hsbuf,local_2058.base,&inlen,
                             (ptls_handshake_properties_t *)0x0);
      if ((local_20e0 == qat.conns[sVar4].tls) &&
         (iVar3 = ptls_buffer__do_pushv(&local_2080,hsbuf.base,hsbuf.off), iVar3 != 0)) {
        return;
      }
      ptls_buffer_dispose(&hsbuf);
      if (iVar2 == 0x20b) break;
      if (iVar2 != 0) {
        fprintf(_stderr,"ptls_handshake returned %d\n");
        abort();
      }
      ppVar6 = qat.conns[sVar4].tls;
      if (ppVar6 == local_20e0) {
        local_20e0 = (ptls_t *)0x1;
      }
      ptls_free(ppVar6);
      qat.conns[sVar4].tls = (ptls_t *)0x0;
      lVar10 = lVar10 + -1;
      if (local_20c8 < 10000) {
        qat.conns[sVar4].next_pending = qat.first_pending;
        qat.first_pending = sVar4;
      }
    }
    ppVar8 = ptls_get_async_job(qat.conns[sVar4].tls);
    if (ppVar8->get_fd == (_func_int_st_ptls_async_job_t_ptr *)0x0) {
      __assert_fail("job->get_fd != NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/t/openssl.c",
                    0x1d9,"void many_handshakes(void)");
    }
    iVar2 = (*ppVar8->get_fd)(ppVar8);
    qat.conns[sVar4].wait_fd = iVar2;
  } while (iVar2 != -1);
  __assert_fail("qat.conns[offending].wait_fd != -1",
                "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/t/openssl.c",0x1db,
                "void many_handshakes(void)");
}

Assistant:

static void many_handshakes(void)
{
    ptls_t *client = ptls_new(ctx, 0), *resp_sample_conn = NULL;
    ptls_buffer_t clientbuf, resp_sample;
    int ret;

    { /* generate ClientHello that we would be sent to all the server-side objects */
        ptls_buffer_init(&clientbuf, "", 0);
        ret = ptls_handshake(client, &clientbuf, NULL, NULL, NULL);
        ok(ret == PTLS_ERROR_IN_PROGRESS);
    }

    ptls_buffer_init(&resp_sample, "", 0);

    qat.first_pending = 0;
    for (size_t i = 0; i < PTLS_ELEMENTSOF(qat.conns); ++i) {
        qat.conns[i].next_pending = i + 1;
        qat.conns[i].tls = NULL;
        qat.conns[i].wait_fd = -1;
    }
    qat.conns[PTLS_ELEMENTSOF(qat.conns) - 1].next_pending = SIZE_MAX;

    struct timeval start, end;
    gettimeofday(&start, NULL);

    static const size_t num_total = 10000;
    size_t num_issued = 0, num_running = 0;
    while (1) {
        while (qat.first_pending != SIZE_MAX) {
            size_t offending = qat.first_pending;
            /* detach the offending entry from pending list */
            qat.first_pending = qat.conns[offending].next_pending;
            qat.conns[offending].next_pending = SIZE_MAX;
            /* run the offending entry */
            if (qat.conns[offending].tls == NULL) {
                qat.conns[offending].tls = ptls_new(ctx_peer, 1);
                if (resp_sample_conn == NULL)
                    resp_sample_conn = qat.conns[offending].tls;
                ++num_issued;
                ++num_running;
            }
            ptls_buffer_t hsbuf;
            uint8_t hsbuf_small[8192];
            ptls_buffer_init(&hsbuf, hsbuf_small, sizeof(hsbuf_small));
            size_t inlen = ptls_get_cipher(qat.conns[offending].tls) == NULL ? clientbuf.off : 0; /* feed CH only as first flight */
            int hsret = ptls_handshake(qat.conns[offending].tls, &hsbuf, clientbuf.base, &inlen, NULL);
            if (resp_sample_conn == qat.conns[offending].tls) {
                ptls_buffer_pushv(&resp_sample, hsbuf.base, hsbuf.off);
            }
            ptls_buffer_dispose(&hsbuf);
            /* advance the handshake context */
            switch (hsret) {
            case 0:
                if (qat.conns[offending].tls == resp_sample_conn)
                    resp_sample_conn = (void *)1;
                ptls_free(qat.conns[offending].tls);
                qat.conns[offending].tls = NULL;
                --num_running;
                if (num_issued < num_total)
                    qat_set_pending(offending);
                break;
            case PTLS_ERROR_ASYNC_OPERATION: {
                ptls_async_job_t *job = ptls_get_async_job(qat.conns[offending].tls);
                assert(job->get_fd != NULL);
                qat.conns[offending].wait_fd = job->get_fd(job);
                assert(qat.conns[offending].wait_fd != -1);
            } break;
            default:
                fprintf(stderr, "ptls_handshake returned %d\n", hsret);
                abort();
                break;
            }
        }
        if (num_running == 0)
            break;
        /* poll for next action */
        fd_set rfds;
        FD_ZERO(&rfds);
        int nfds = 0;
        for (size_t i = 0; i < PTLS_ELEMENTSOF(qat.conns); ++i) {
            if (qat.conns[i].wait_fd != -1) {
                FD_SET(qat.conns[i].wait_fd, &rfds);
                if (nfds <= qat.conns[i].wait_fd)
                    nfds = qat.conns[i].wait_fd + 1;
            }
        }
        if (select(nfds, &rfds, NULL, NULL, NULL) > 0) {
            for (size_t i = 0; i < PTLS_ELEMENTSOF(qat.conns); ++i) {
                if (qat.conns[i].wait_fd != -1 && FD_ISSET(qat.conns[i].wait_fd, &rfds)) {
                    qat.conns[i].wait_fd = -1;
                    qat_set_pending(i);
                }
            }
        }
    }

    gettimeofday(&end, NULL);

    note("run %zu handshakes in %f seconds", num_total,
         (end.tv_sec + end.tv_usec / 1000000.) - (start.tv_sec + start.tv_usec / 1000000.));

    clientbuf.off = 0;

    /* confirm that the response looks okay */
    size_t resplen = resp_sample.off;
    ok(ptls_handshake(client, &clientbuf, resp_sample.base, &resplen, NULL) == 0);

    ptls_buffer_dispose(&clientbuf);
    ptls_buffer_dispose(&resp_sample);
    ptls_free(client);

    return;
Exit:
    assert("unreachable");
}